

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_meshb(REF_GRID ref_grid,char *filename)

{
  int iVar1;
  REF_NODE ref_node;
  REF_INT *pRVar2;
  REF_SIZE RVar3;
  uint version;
  uint uVar4;
  REF_STATUS RVar5;
  FILE *__s;
  REF_CELL pRVar6;
  long lVar7;
  ulong uVar8;
  undefined8 uVar9;
  REF_GEOM pRVar10;
  REF_CELL pRVar11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  REF_CELL next_position;
  REF_INT RVar19;
  ulong uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  REF_INT keyword_code;
  REF_INT *n2o;
  REF_INT *o2n;
  double double_gref;
  REF_INT code;
  uint local_11c;
  REF_CELL local_118;
  uint local_10c;
  REF_GEOM local_108;
  ulong local_100;
  REF_CELL local_f8;
  int local_ec;
  ulong local_e8;
  REF_INT *local_e0;
  REF_INT *local_d8;
  uint local_d0;
  uint local_cc;
  REF_CELL local_c8;
  long local_c0;
  double local_b8;
  undefined4 local_ac;
  REF_INT local_a8;
  undefined1 local_a4 [16];
  
  ref_node = ref_grid->node;
  local_108 = ref_grid->geom;
  local_ec = (ref_grid->twod == 0) + 2;
  local_10c = 2;
  uVar4 = ref_grid->meshb_version;
  if ((int)uVar4 < 2) {
    if (ref_node->old_n_global < 0x989681) {
      uVar17 = 8;
      uVar15 = 1;
      local_100 = 4;
    }
    else {
      bVar21 = (ulong)ref_node->old_n_global < 0xbebc201;
      uVar15 = (uint)bVar21;
      local_10c = 4 - bVar21;
      local_100 = (ulong)((uint)!bVar21 * 4 + 4);
      uVar17 = 0xc;
    }
  }
  else {
    uVar15 = (uint)(uVar4 < 4);
    local_100 = (ulong)((uint)(uVar4 >= 4) * 4 + 4);
    uVar17 = (uint)(uVar4 != 2) * 4 + 8;
    local_10c = uVar4;
  }
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x79d,
           "ref_export_meshb","unable to open file");
    return 2;
  }
  uVar4 = ref_node_compact(ref_node,&local_d8,&local_e0);
  if (uVar4 == 0) {
    local_ac = 1;
    pRVar6 = (REF_CELL)fwrite(&local_ac,4,1,__s);
    if (pRVar6 == (REF_CELL)0x1) {
      pRVar6 = (REF_CELL)fwrite(&local_10c,4,1,__s);
      if (pRVar6 == (REF_CELL)0x1) {
        lVar7 = ftell(__s);
        local_11c = 3;
        pRVar6 = (REF_CELL)fwrite(&local_11c,4,1,__s);
        version = local_10c;
        if (pRVar6 == (REF_CELL)0x1) {
          local_118 = (REF_CELL)((ulong)uVar17 + lVar7 + 4);
          uVar4 = ref_export_meshb_next_position((FILE *)__s,local_10c,(REF_FILEPOS)local_118);
          pRVar11 = local_118;
          if (uVar4 != 0) {
            pcVar13 = "next pos";
            uVar9 = 0x7a7;
            goto LAB_0011c414;
          }
          pRVar6 = (REF_CELL)fwrite(&local_ec,4,1,__s);
          if (pRVar6 == (REF_CELL)0x1) {
            pRVar6 = (REF_CELL)ftell(__s);
            if (pRVar11 == pRVar6) {
              iVar1 = ref_node->n;
              local_e8 = (ulong)(uVar17 + (int)local_100);
              if ((long)iVar1 < 1) {
LAB_0011c88a:
                local_cc = uVar15 ^ 3;
                lVar7 = 0;
                uVar12 = local_100;
                do {
                  pRVar6 = ref_grid->cell[lVar7];
                  if (0 < pRVar6->n) {
                    local_c0 = lVar7;
                    uVar4 = ref_cell_meshb_keyword(pRVar6,(REF_INT *)&local_11c);
                    if (uVar4 != 0) {
                      pcVar13 = "kw";
                      uVar9 = 0x7ca;
                      goto LAB_0011c414;
                    }
                    local_f8 = (REF_CELL)(long)pRVar6->node_per;
                    lVar7 = ftell(__s);
                    iVar1 = pRVar6->n;
                    local_d0 = (int)local_f8 + 1;
                    iVar14 = local_d0 << ((byte)local_cc & 0x1f);
                    local_118 = pRVar6;
                    pRVar6 = (REF_CELL)fwrite(&local_11c,4,1,__s);
                    if (pRVar6 != (REF_CELL)0x1) {
                      pcVar13 = "keyword code";
                      pRVar11 = (REF_CELL)0x1;
                      uVar9 = 1999;
                      goto LAB_0011c5b7;
                    }
                    pRVar11 = (REF_CELL)((long)iVar1 * (long)iVar14 + lVar7 + local_e8);
                    uVar4 = ref_export_meshb_next_position((FILE *)__s,version,(REF_FILEPOS)pRVar11)
                    ;
                    pRVar6 = local_118;
                    if (uVar4 != 0) {
                      pcVar13 = "next";
                      uVar9 = 2000;
                      goto LAB_0011c414;
                    }
                    local_c8 = pRVar11;
                    uVar4 = ref_export_meshb_int((FILE *)__s,version,local_118->n);
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x7d1,"ref_export_meshb",(ulong)uVar4,"ncell");
                      goto LAB_0011c5be;
                    }
                    if (0 < pRVar6->max) {
                      iVar1 = (int)local_f8;
                      uVar20 = (ulong)local_f8 & 0xffffffff;
                      uVar12 = (ulong)local_d0;
                      RVar19 = 0;
                      do {
                        RVar5 = ref_cell_nodes(pRVar6,RVar19,&local_a8);
                        if (RVar5 == 0) {
                          if (0 < (int)local_f8) {
                            uVar8 = 0;
                            do {
                              *(REF_INT *)(local_a4 + uVar8 * 4 + -4) =
                                   local_d8[*(int *)(local_a4 + uVar8 * 4 + -4)] + 1;
                              uVar8 = uVar8 + 1;
                            } while (uVar20 != uVar8);
                          }
                          if (local_118->type == REF_CELL_PYR) {
                            auVar22._0_8_ = local_a4._8_8_;
                            auVar22._8_4_ = local_a4._0_4_;
                            auVar22._12_4_ = local_a4._4_4_;
                            local_a4 = auVar22;
                          }
                          if (local_118->last_node_is_an_id == 0) {
                            *(undefined4 *)(local_a4 + (long)local_f8 * 4 + -4) = 0;
                          }
                          if (-1 < iVar1) {
                            uVar8 = 0;
                            do {
                              RVar5 = ref_export_meshb_int
                                                ((FILE *)__s,version,
                                                 *(REF_INT *)(local_a4 + uVar8 * 4 + -4));
                              if (RVar5 != 0) {
                                pcVar13 = "c2n";
                                uVar9 = 0x7e7;
                                goto LAB_0011cd37;
                              }
                              uVar8 = uVar8 + 1;
                            } while (uVar12 != uVar8);
                          }
                        }
                        RVar19 = RVar19 + 1;
                        pRVar6 = local_118;
                      } while (RVar19 < local_118->max);
                    }
                    pRVar6 = (REF_CELL)ftell(__s);
                    uVar12 = local_100;
                    lVar7 = local_c0;
                    if (local_c8 != pRVar6) {
                      pcVar13 = "cell inconsistent";
                      uVar9 = 0x7ea;
                      pRVar11 = local_c8;
                      goto LAB_0011c5b7;
                    }
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 0x10);
                local_100 = (ulong)(uint)((int)uVar12 * 2);
                uVar12 = 0;
                pRVar10 = local_108;
                do {
                  if (0 < (long)pRVar10->max) {
                    lVar7 = 0;
                    uVar20 = 0;
                    do {
                      uVar15 = (int)uVar20 +
                               (uint)(uVar12 == *(uint *)((long)pRVar10->descr + lVar7));
                      uVar20 = (ulong)uVar15;
                      lVar7 = lVar7 + 0x18;
                    } while ((long)pRVar10->max * 0x18 != lVar7);
                    if (uVar15 != 0) {
                      local_11c = (uint)uVar12 | 0x28;
                      lVar7 = ftell(__s);
                      pRVar6 = (REF_CELL)fwrite(&local_11c,4,1,__s);
                      if (pRVar6 != (REF_CELL)0x1) {
                        pcVar13 = "keyword";
                        pRVar11 = (REF_CELL)0x1;
                        uVar9 = 0x7f7;
                        goto LAB_0011c5b7;
                      }
                      local_f8 = (REF_CELL)
                                 (lVar7 + local_e8 +
                                 (local_100 + uVar12 * 8 + (ulong)(uVar12 != 0) * 8) * uVar20);
                      uVar4 = ref_export_meshb_next_position
                                        ((FILE *)__s,version,(REF_FILEPOS)local_f8);
                      if (uVar4 != 0) {
                        pcVar13 = "next";
                        uVar9 = 0x7f8;
                        goto LAB_0011c414;
                      }
                      RVar5 = ref_export_meshb_int((FILE *)__s,version,uVar15);
                      if (RVar5 != 0) {
                        pcVar13 = "ngeom";
                        uVar9 = 0x7f9;
                        goto LAB_0011cd37;
                      }
                      if (0 < local_108->max) {
                        lVar18 = 0;
                        lVar7 = 0;
                        pRVar10 = local_108;
                        do {
                          pRVar2 = pRVar10->descr;
                          local_118 = (REF_CELL)(lVar7 * 6);
                          if (uVar12 == (uint)pRVar2[lVar7 * 6]) {
                            RVar19 = pRVar2[lVar7 * 6 + 1];
                            RVar5 = ref_export_meshb_int
                                              ((FILE *)__s,version,
                                               local_d8[pRVar2[lVar7 * 6 + 5]] + 1);
                            if (RVar5 != 0) {
                              pcVar13 = "node";
                              uVar9 = 0x7fd;
                              goto LAB_0011cd37;
                            }
                            RVar5 = ref_export_meshb_int((FILE *)__s,version,RVar19);
                            if (RVar5 != 0) {
                              pcVar13 = "id";
                              uVar9 = 0x7fe;
                              goto LAB_0011cd37;
                            }
                            pRVar10 = local_108;
                            lVar16 = lVar18;
                            uVar20 = uVar12;
                            if (uVar12 != 0) {
                              do {
                                pRVar6 = (REF_CELL)
                                         fwrite((void *)((long)local_108->param + lVar16),8,1,__s);
                                if (pRVar6 != (REF_CELL)0x1) {
                                  pcVar13 = "id";
                                  pRVar11 = (REF_CELL)0x1;
                                  uVar9 = 0x803;
                                  goto LAB_0011c5b7;
                                }
                                lVar16 = lVar16 + 8;
                                uVar20 = uVar20 - 1;
                              } while (uVar20 != 0);
                              local_b8 = (double)local_108->descr
                                                 [(long)((long)&local_118->type + 2)];
                              pRVar6 = (REF_CELL)fwrite(&local_b8,8,1,__s);
                              pRVar10 = local_108;
                              if (pRVar6 != (REF_CELL)0x1) {
                                pcVar13 = "gref";
                                pRVar11 = (REF_CELL)0x1;
                                uVar9 = 0x806;
                                goto LAB_0011c5b7;
                              }
                            }
                          }
                          lVar7 = lVar7 + 1;
                          lVar18 = lVar18 + 0x10;
                        } while (lVar7 < pRVar10->max);
                      }
                      pRVar6 = (REF_CELL)ftell(__s);
                      pRVar10 = local_108;
                      if (local_f8 != pRVar6) {
                        pcVar13 = "geom inconsistent";
                        uVar9 = 0x809;
                        pRVar11 = local_f8;
                        goto LAB_0011c5b7;
                      }
                    }
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar12 != 3);
                RVar3 = pRVar10->cad_data_size;
                if (RVar3 == 0) {
LAB_0011d129:
                  local_11c = 0x36;
                  pRVar6 = (REF_CELL)fwrite(&local_11c,4,1,__s);
                  if (pRVar6 == (REF_CELL)0x1) {
                    uVar4 = ref_export_meshb_next_position((FILE *)__s,version,0);
                    if (uVar4 == 0) {
                      if (local_e0 != (REF_INT *)0x0) {
                        free(local_e0);
                      }
                      if (local_d8 != (REF_INT *)0x0) {
                        free(local_d8);
                      }
                      fclose(__s);
                      return 0;
                    }
                    pcVar13 = "next p";
                    uVar9 = 0x820;
                    goto LAB_0011c414;
                  }
                  pcVar13 = "vertex version code";
                  uVar9 = 0x81e;
                  pRVar11 = (REF_CELL)0x1;
                }
                else {
                  local_11c = 0x7e;
                  lVar7 = ftell(__s);
                  pRVar6 = (REF_CELL)fwrite(&local_11c,4,1,__s);
                  if (pRVar6 == (REF_CELL)0x1) {
                    next_position = (REF_CELL)(RVar3 + local_e8 + lVar7);
                    uVar4 = ref_export_meshb_next_position
                                      ((FILE *)__s,version,(REF_FILEPOS)next_position);
                    if (uVar4 != 0) {
                      pcVar13 = "next p";
                      uVar9 = 0x812;
                      goto LAB_0011c414;
                    }
                    RVar5 = ref_export_meshb_int
                                      ((FILE *)__s,version,(REF_INT)local_108->cad_data_size);
                    if (RVar5 != 0) {
                      pcVar13 = "size in bytes";
                      uVar9 = 0x814;
                      goto LAB_0011cd37;
                    }
                    pRVar11 = (REF_CELL)local_108->cad_data_size;
                    pRVar6 = (REF_CELL)fwrite(local_108->cad_data,1,(size_t)pRVar11,__s);
                    if (pRVar11 == pRVar6) {
                      pRVar6 = (REF_CELL)ftell(__s);
                      if (next_position == pRVar6) goto LAB_0011d129;
                      pcVar13 = "cad_model inconsistent";
                      uVar9 = 0x819;
                      pRVar11 = next_position;
                    }
                    else {
                      pcVar13 = "node";
                      uVar9 = 0x818;
                    }
                  }
                  else {
                    pcVar13 = "keyword";
                    uVar9 = 0x811;
                    pRVar11 = (REF_CELL)0x1;
                  }
                }
              }
              else {
                local_118 = (REF_CELL)(long)local_ec;
                lVar7 = ftell(__s);
                local_11c = 4;
                pRVar6 = (REF_CELL)fwrite(&local_11c,4,1,__s);
                if (pRVar6 == (REF_CELL)0x1) {
                  pRVar6 = (REF_CELL)
                           (lVar7 + local_e8 +
                           ((local_100 & 0xffffffff) + (long)local_118 * 8) * (long)iVar1);
                  uVar4 = ref_export_meshb_next_position((FILE *)__s,version,(REF_FILEPOS)pRVar6);
                  if (uVar4 != 0) {
                    pcVar13 = "next p";
                    uVar9 = 0x7b2;
                    goto LAB_0011c414;
                  }
                  local_118 = pRVar6;
                  RVar5 = ref_export_meshb_int((FILE *)__s,version,ref_node->n);
                  if (RVar5 != 0) {
                    pcVar13 = "nnode";
                    uVar9 = 0x7b3;
LAB_0011cd37:
                    uVar4 = 1;
                    uVar12 = 1;
                    goto LAB_0011c417;
                  }
                  if (0 < ref_node->n) {
                    lVar7 = 0;
                    do {
                      pRVar6 = (REF_CELL)
                               fwrite(ref_node->real + (long)local_e0[lVar7] * 0xf,8,1,__s);
                      if (pRVar6 != (REF_CELL)0x1) {
                        pcVar13 = "x";
                        pRVar11 = (REF_CELL)0x1;
                        uVar9 = 0x7b8;
                        goto LAB_0011c5b7;
                      }
                      pRVar6 = (REF_CELL)
                               fwrite(ref_node->real + (long)local_e0[lVar7] * 0xf + 1,8,1,__s);
                      if (pRVar6 != (REF_CELL)0x1) {
                        pcVar13 = "y";
                        pRVar11 = (REF_CELL)0x1;
                        uVar9 = 0x7bc;
                        goto LAB_0011c5b7;
                      }
                      if ((ref_grid->twod == 0) &&
                         (pRVar6 = (REF_CELL)
                                   fwrite(ref_node->real + (long)local_e0[lVar7] * 0xf + 2,8,1,__s),
                         pRVar6 != (REF_CELL)0x1)) {
                        pcVar13 = "z";
                        pRVar11 = (REF_CELL)0x1;
                        uVar9 = 0x7c1;
                        goto LAB_0011c5b7;
                      }
                      RVar5 = ref_export_meshb_int((FILE *)__s,version,1);
                      if (RVar5 != 0) {
                        pcVar13 = "nnode";
                        uVar9 = 0x7c3;
                        goto LAB_0011cd37;
                      }
                      lVar7 = lVar7 + 1;
                    } while (lVar7 < ref_node->n);
                  }
                  pRVar6 = (REF_CELL)ftell(__s);
                  if (local_118 == pRVar6) goto LAB_0011c88a;
                  pcVar13 = "vertex inconsistent";
                  uVar9 = 0x7c5;
                  pRVar11 = local_118;
                }
                else {
                  pcVar13 = "vertex version code";
                  pRVar11 = (REF_CELL)0x1;
                  uVar9 = 0x7b1;
                }
              }
            }
            else {
              pcVar13 = "dim inconsistent";
              uVar9 = 0x7a9;
            }
          }
          else {
            pcVar13 = "dim";
            pRVar11 = (REF_CELL)0x1;
            uVar9 = 0x7a8;
          }
        }
        else {
          pcVar13 = "dim code";
          pRVar11 = (REF_CELL)0x1;
          uVar9 = 0x7a6;
        }
      }
      else {
        pcVar13 = "version";
        pRVar11 = (REF_CELL)0x1;
        uVar9 = 0x7a3;
      }
    }
    else {
      pcVar13 = "code";
      pRVar11 = (REF_CELL)0x1;
      uVar9 = 0x7a2;
    }
LAB_0011c5b7:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar9,
           "ref_export_meshb",pcVar13,pRVar11,pRVar6);
LAB_0011c5be:
    uVar4 = 1;
  }
  else {
    pcVar13 = "compact";
    uVar9 = 0x79f;
LAB_0011c414:
    uVar12 = (ulong)uVar4;
LAB_0011c417:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar9,
           "ref_export_meshb",uVar12,pcVar13);
  }
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_export_meshb(REF_GRID ref_grid,
                                           const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT *o2n, *n2o;
  REF_INT code, version, dim;
  REF_FILEPOS next_position;
  REF_INT keyword_code, header_size, int_size, fp_size;
  REF_INT node;
  REF_INT group, node_per, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER + 1]; /* everyone gets id in meshb */
  REF_INT type, id, i, size_bytes;
  REF_INT n0, n1, n2, n3, n4;
  REF_INT geom;
  int ngeom;

  dim = 3;
  if (ref_grid_twod(ref_grid)) dim = 2;

  version = 2;
  if (1 < ref_grid_meshb_version(ref_grid)) {
    version = ref_grid_meshb_version(ref_grid);
  } else {
    if (REF_EXPORT_MESHB_VERTEX_3 < ref_node_n_global(ref_node)) version = 3;
    if (REF_EXPORT_MESHB_VERTEX_4 < ref_node_n_global(ref_node)) version = 4;
  }

  int_size = 4;
  fp_size = 4;
  if (2 < version) fp_size = 8;
  if (3 < version) int_size = 8;
  header_size = 4 + fp_size + int_size;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  code = 1;
  REIS(1, fwrite(&code, sizeof(int), 1, file), "code");
  REIS(1, fwrite(&version, sizeof(int), 1, file), "version");
  next_position = (REF_FILEPOS)(4 + fp_size + 4) + ftell(file);
  keyword_code = 3;
  REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "dim code");
  RSS(ref_export_meshb_next_position(file, version, next_position), "next pos");
  REIS(1, fwrite(&dim, sizeof(int), 1, file), "dim");
  REIS(next_position, ftell(file), "dim inconsistent");

  if (ref_node_n(ref_node) > 0) {
    next_position =
        (REF_FILEPOS)header_size +
        (REF_FILEPOS)ref_node_n(ref_node) * (REF_FILEPOS)(dim * 8 + int_size) +
        ftell(file);
    keyword_code = 4;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "vertex version code");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    RSS(ref_export_meshb_int(file, version, ref_node_n(ref_node)), "nnode");
    for (node = 0; node < ref_node_n(ref_node); node++) {
      REIS(1,
           fwrite(&(ref_node_xyz(ref_node, 0, n2o[node])), sizeof(double), 1,
                  file),
           "x");
      REIS(1,
           fwrite(&(ref_node_xyz(ref_node, 1, n2o[node])), sizeof(double), 1,
                  file),
           "y");
      if (!ref_grid_twod(ref_grid))
        REIS(1,
             fwrite(&(ref_node_xyz(ref_node, 2, n2o[node])), sizeof(double), 1,
                    file),
             "z");
      RSS(ref_export_meshb_int(file, version, REF_EXPORT_MESHB_VERTEX_ID),
          "nnode");
    }
    REIS(next_position, ftell(file), "vertex inconsistent");
  }

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (ref_cell_n(ref_cell) > 0) {
      RSS(ref_cell_meshb_keyword(ref_cell, &keyword_code), "kw");
      node_per = ref_cell_node_per(ref_cell);
      next_position = ftell(file) + (REF_FILEPOS)header_size +
                      (REF_FILEPOS)ref_cell_n(ref_cell) *
                          (REF_FILEPOS)(int_size * (node_per + 1));
      REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "keyword code");
      RSS(ref_export_meshb_next_position(file, version, next_position), "next");
      RSS(ref_export_meshb_int(file, version, ref_cell_n(ref_cell)), "ncell");
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        for (node = 0; node < node_per; node++) {
          nodes[node] = o2n[nodes[node]] + 1;
        }
        if (REF_CELL_PYR == ref_cell_type(ref_cell)) {
          /* convention: square basis is 0-1-2-3
             (oriented counter clockwise like trias) and top vertex is 4 */
          n0 = nodes[0];
          n1 = nodes[3];
          n2 = nodes[4];
          n3 = nodes[1];
          n4 = nodes[2];
          nodes[0] = n0;
          nodes[1] = n1;
          nodes[2] = n2;
          nodes[3] = n3;
          nodes[4] = n4;
        }
        if (!ref_cell_last_node_is_an_id(ref_cell))
          nodes[node_per] = REF_EXPORT_MESHB_3D_ID;
        for (node = 0; node < (1 + node_per); node++) {
          RSS(ref_export_meshb_int(file, version, nodes[node]), "c2n");
        }
      }
      REIS(next_position, ftell(file), "cell inconsistent");
    }
  }

  each_ref_type(ref_geom, type) {
    ngeom = 0;
    each_ref_geom_of(ref_geom, type, geom) ngeom++;
    if (ngeom > 0) {
      keyword_code = 40 + type; /* GmfVerticesOnGeometricVertices */
      next_position =
          ftell(file) + (REF_FILEPOS)header_size +
          (REF_FILEPOS)ngeom *
              (REF_FILEPOS)(int_size * 2 + 8 * type + (0 < type ? 8 : 0));
      REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "keyword");
      RSS(ref_export_meshb_next_position(file, version, next_position), "next");
      RSS(ref_export_meshb_int(file, version, ngeom), "ngeom");
      each_ref_geom_of(ref_geom, type, geom) {
        node = o2n[ref_geom_node(ref_geom, geom)] + 1;
        id = ref_geom_id(ref_geom, geom);
        RSS(ref_export_meshb_int(file, version, node), "node");
        RSS(ref_export_meshb_int(file, version, id), "id");
        for (i = 0; i < type; i++)
          REIS(1,
               fwrite(&(ref_geom_param(ref_geom, i, geom)), sizeof(double), 1,
                      file),
               "id");
        if (0 < type) {
          double double_gref = (double)ref_geom_gref(ref_geom, geom);
          REIS(1, fwrite(&(double_gref), sizeof(double), 1, file), "gref");
        }
      }
      REIS(next_position, ftell(file), "geom inconsistent");
    }
  }

  if (0 < ref_geom_cad_data_size(ref_geom)) {
    keyword_code = 126; /* GmfByteFlow 173-47 */
    next_position = (REF_FILEPOS)header_size +
                    (REF_FILEPOS)ref_geom_cad_data_size(ref_geom) + ftell(file);
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "keyword");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    size_bytes = (REF_INT)ref_geom_cad_data_size(ref_geom);
    RSS(ref_export_meshb_int(file, version, size_bytes), "size in bytes");
    REIS(ref_geom_cad_data_size(ref_geom),
         fwrite(ref_geom_cad_data(ref_geom), sizeof(REF_BYTE),
                ref_geom_cad_data_size(ref_geom), file),
         "node");
    REIS(next_position, ftell(file), "cad_model inconsistent");
  }

  /* End */
  keyword_code = 54; /* GmfEnd 101-47 */
  REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "vertex version code");
  next_position = 0;
  RSS(ref_export_meshb_next_position(file, version, next_position), "next p");

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}